

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLcode Curl_cf_ssl_proxy_insert_after(Curl_cfilter *cf_at,Curl_easy *data)

{
  CURLcode CVar1;
  ssl_connect_data *ctx;
  Curl_cfilter *local_20;
  
  local_20 = (Curl_cfilter *)0x0;
  ctx = cf_ctx_new((Curl_easy *)(((long)cf_at->conn->bits << 0x27) >> 0x3f & 0x17f6f8),
                   (alpn_spec *)data);
  if (ctx == (ssl_connect_data *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    CVar1 = Curl_cf_create(&local_20,&Curl_cft_ssl_proxy,ctx);
    if (CVar1 == CURLE_OK) {
      Curl_conn_cf_insert_after(cf_at,local_20);
      return CURLE_OK;
    }
  }
  cf_ctx_free(ctx);
  return CVar1;
}

Assistant:

CURLcode Curl_cf_ssl_proxy_insert_after(struct Curl_cfilter *cf_at,
                                        struct Curl_easy *data)
{
  struct Curl_cfilter *cf;
  CURLcode result;

  result = cf_ssl_proxy_create(&cf, data, cf_at->conn);
  if(!result)
    Curl_conn_cf_insert_after(cf_at, cf);
  return result;
}